

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_stdlib.cpp
# Opt level: O0

bool ImGui::InputText(char *label,string *str,ImGuiInputTextFlags flags,
                     ImGuiInputTextCallback callback,void *user_data)

{
  bool bVar1;
  char *buf;
  size_type sVar2;
  string *local_48;
  InputTextCallback_UserData cb_user_data;
  void *user_data_local;
  ImGuiInputTextCallback callback_local;
  ImGuiInputTextFlags flags_local;
  string *str_local;
  char *label_local;
  
  cb_user_data.ChainCallbackUserData = user_data;
  if ((flags & 0x40000U) == 0) {
    local_48 = str;
    cb_user_data.Str = (string *)callback;
    cb_user_data.ChainCallback = (ImGuiInputTextCallback)user_data;
    buf = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    (str);
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            capacity(str);
    bVar1 = InputText(label,buf,sVar2 + 1,flags | 0x40000,InputTextCallback,&local_48);
    return bVar1;
  }
  __assert_fail("(flags & ImGuiInputTextFlags_CallbackResize) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/misc/cpp/imgui_stdlib.cpp"
                ,0x28,
                "bool ImGui::InputText(const char *, std::string *, ImGuiInputTextFlags, ImGuiInputTextCallback, void *)"
               );
}

Assistant:

bool ImGui::InputText(const char* label, std::string* str, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data)
{
    IM_ASSERT((flags & ImGuiInputTextFlags_CallbackResize) == 0);
    flags |= ImGuiInputTextFlags_CallbackResize;

    InputTextCallback_UserData cb_user_data;
    cb_user_data.Str = str;
    cb_user_data.ChainCallback = callback;
    cb_user_data.ChainCallbackUserData = user_data;
    return InputText(label, (char*)str->c_str(), str->capacity() + 1, flags, InputTextCallback, &cb_user_data);
}